

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v6::detail::
     handle_int_type_spec<fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>&>
               (char spec,
               int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
               *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 99) {
    if (iVar1 < 0x4c) {
      if (iVar1 == 0) {
LAB_0010a90a:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
        ::on_dec(handler);
        return;
      }
      if (iVar1 == 0x42) {
LAB_0010a8f8:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
        ::on_bin(handler);
        return;
      }
    }
    else {
      if (iVar1 == 0x4c) {
LAB_0010a912:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
        ::on_num(handler);
        return;
      }
      if (iVar1 == 0x58) {
LAB_0010a8e7:
        int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
        ::on_hex(handler);
        return;
      }
      if (iVar1 == 0x62) goto LAB_0010a8f8;
    }
  }
  else if (iVar1 < 0x6e) {
    if (iVar1 == 99) {
      int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
      ::on_chr(handler);
      return;
    }
    if (iVar1 == 100) goto LAB_0010a90a;
  }
  else {
    if (iVar1 == 0x6e) goto LAB_0010a912;
    if (iVar1 == 0x6f) {
      int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
      ::on_oct(handler);
      return;
    }
    if (iVar1 == 0x78) goto LAB_0010a8e7;
  }
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
  on_error(handler);
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
  case 'L':
    handler.on_num();
    break;
  case 'c':
    handler.on_chr();
    break;
  default:
    handler.on_error();
  }
}